

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_search.c
# Opt level: O0

int32 ngram_search_prob(ps_search_t *search)

{
  ps_lattice_t *ppVar1;
  ps_latlink_t *ppVar2;
  ps_latlink_t *link;
  ps_lattice_t *dag;
  ngram_search_t *ngs;
  ps_search_t *search_local;
  
  if ((*(char *)((long)&search[1].name + 2) == '\0') ||
     (*(char *)((long)&search[1].name + 3) == '\0')) {
    search_local._4_4_ = 0;
  }
  else {
    ppVar1 = ngram_search_lattice(search);
    if (ppVar1 == (ps_lattice_t *)0x0) {
      search_local._4_4_ = 0;
    }
    else {
      ppVar2 = ngram_search_bestpath(search,(int32 *)0x0,1);
      if (ppVar2 == (ps_latlink_t *)0x0) {
        search_local._4_4_ = 0;
      }
      else {
        search_local._4_4_ = search->post;
      }
    }
  }
  return search_local._4_4_;
}

Assistant:

static int32
ngram_search_prob(ps_search_t *search)
{
    ngram_search_t *ngs = (ngram_search_t *)search;

    /* Only do bestpath search if the utterance is done. */
    if (ngs->bestpath && ngs->done) {
        ps_lattice_t *dag;
        ps_latlink_t *link;

        if ((dag = ngram_search_lattice(search)) == NULL)
            return 0;
        if ((link = ngram_search_bestpath(search, NULL, TRUE)) == NULL)
            return 0;
        return search->post;
    }
    else {
        /* FIXME: Give some kind of good estimate here, eventually. */
        return 0;
    }
}